

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O1

bool tinyusdz::tydra::BuildXformNodeFromStage
               (Stage *stage,XformNode *rootNode,double t,TimeSampleInterpolationType tinterp)

{
  pointer pcVar1;
  pointer pPVar2;
  bool bVar3;
  long lVar4;
  char *__end;
  optional<tinyusdz::Path::PathType> oVar5;
  pointer *ppPVar6;
  undefined8 *puVar7;
  undefined8 uVar8;
  pointer parent_abs_path;
  bool bVar9;
  byte bVar10;
  XformNode node;
  matrix4d in_stack_fffffffffffff908;
  undefined1 local_640 [272];
  _Alloc_hider local_530;
  size_type sStack_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_520;
  _Alloc_hider local_510;
  size_type sStack_508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_500;
  _Alloc_hider local_4f0;
  size_type local_4e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_4e0;
  _Alloc_hider _Stack_4d0;
  size_type local_4c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c0;
  optional<tinyusdz::Path::PathType> local_4b0;
  undefined8 uStack_4a8;
  _Alloc_hider local_4a0;
  size_type local_498;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490;
  _Alloc_hider local_480;
  size_type sStack_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  _Alloc_hider _Stack_460;
  size_type local_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_450;
  _Alloc_hider local_440;
  size_type sStack_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  _Alloc_hider local_420;
  size_type local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410;
  _Alloc_hider local_400;
  size_type sStack_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0;
  optional<tinyusdz::Path::PathType> oStack_3e0;
  undefined8 local_3d8;
  _Alloc_hider _Stack_3d0;
  size_type local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  undefined8 local_3b0;
  storage_union sStack_3a8;
  string local_398;
  string local_378;
  _Base_ptr local_358;
  size_t local_350;
  bool local_348 [16];
  undefined1 local_338 [32];
  _Alloc_hider local_318;
  _Base_ptr local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  _Alloc_hider local_2f8;
  _Alloc_hider local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  undefined8 local_2d8;
  size_type local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  _Alloc_hider local_2b8;
  size_type local_2b0;
  undefined1 local_2a8 [48];
  bool local_278;
  storage_t<tinyusdz::Path::PathType> local_274;
  undefined1 local_270 [48];
  optional<double> oStack_240;
  optional<tinyusdz::Token> local_230;
  optional<tinyusdz::Token> local_208;
  optional<tinyusdz::Token> local_1e0;
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_1b8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  optional<tinyusdz::Token> local_130;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_108;
  pointer local_d8;
  pointer pSStack_d0;
  pointer local_c8;
  pointer pPStack_c0;
  pointer local_b8;
  pointer local_b0;
  optional<tinyusdz::Axis> local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  _Alloc_hider _Stack_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  optional<tinyusdz::Interpolation> local_70;
  optional<unsigned_int> oStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  bVar10 = 0;
  if (rootNode == (XformNode *)0x0) {
    bVar9 = false;
  }
  else {
    local_358 = (_Base_ptr)local_348;
    local_350 = 0;
    local_348[0] = false;
    local_338._0_8_ = local_338 + 0x10;
    local_338._8_8_ = (pointer)0x0;
    local_338[0x10] = '\0';
    local_318._M_p = (pointer)&local_308;
    local_310 = (_Base_ptr)0x0;
    local_308._M_local_buf[0] = '\0';
    local_2f8._M_p = (pointer)&local_2e8;
    local_2f0._M_p = (pointer)0x0;
    local_2e8._M_local_buf[0] = '\0';
    local_2d8 = &local_2c8;
    local_2d0 = 0;
    local_2c8._M_local_buf[0] = '\0';
    local_2b8._M_p = local_2a8;
    local_2b0 = 0;
    local_2a8[0] = '\0';
    local_2a8._16_8_ = local_2a8 + 0x20;
    local_2a8._24_8_ = 0;
    local_2a8[0x20] = '\0';
    local_278 = false;
    local_274 = (storage_t<tinyusdz::Path::PathType>)0x0;
    local_270[0] = false;
    local_270._8_8_ = 0;
    local_270._16_8_ = 0xffffffffffffffff;
    local_270._40_8_ = 0;
    oStack_240.has_value_ = false;
    oStack_240._1_7_ = 0;
    local_270._24_8_ = 0;
    local_270._32_8_ = 0;
    oStack_240.contained._0_2_ = 0;
    local_230.has_value_ = false;
    local_230._1_7_ = 0x3ff00000000000;
    local_230.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_230.contained._8_8_ = 0;
    local_230.contained._16_8_ = 0;
    local_230.contained._24_8_ = 0;
    local_208.has_value_ = false;
    local_208._1_7_ = 0x3ff00000000000;
    local_208.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_208.contained._8_8_ = 0;
    local_208.contained._16_8_ = 0;
    local_208.contained._24_8_ = 0;
    local_1e0.has_value_ = false;
    local_1e0._1_7_ = 0x3ff00000000000;
    local_1e0.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_1e0.contained._8_8_ = 0;
    local_1e0.contained._16_8_ = 0;
    local_1e0.contained._24_8_ = 0;
    local_1b8.has_value_ = false;
    local_1b8._1_7_ = 0x3ff00000000000;
    local_1b8.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x3ff0000000000000;
    local_1b8.contained._40_8_ = 0x3ff0000000000000;
    local_180.contained._24_8_ = 0x3ff0000000000000;
    local_158.has_value_ = false;
    local_158._1_7_ = 0;
    local_158.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_158.contained._8_8_ = 0;
    local_158.contained._16_8_ = 0;
    local_158.contained._24_8_ = 0x3ff0000000000000;
    local_1b8.contained._8_8_ = 0;
    local_1b8.contained._16_8_ = 0;
    local_1b8.contained._24_8_ = 0;
    local_1b8.contained._32_8_ = 0;
    local_180.has_value_ = false;
    local_180._1_7_ = 0;
    local_180.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_180.contained._8_8_ = 0;
    local_180.contained._16_8_ = 0;
    local_130.has_value_ = false;
    local_130._1_7_ = 0x3ff00000000000;
    local_130.contained._16_8_ = 0;
    local_130.contained._24_8_ = 0;
    local_130.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_130.contained._8_8_ = 0;
    local_108._0_8_ = 0x3ff0000000000000;
    local_108.super__Rb_tree_header._M_header._M_color = _S_red;
    local_108.super__Rb_tree_header._M_header._4_4_ = 0;
    local_108.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_108.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_108.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_108.super__Rb_tree_header._M_node_count = 0x3ff0000000000000;
    local_d8 = (pointer)0x0;
    pSStack_d0 = (pointer)0x0;
    local_c8 = (pointer)0x0;
    pPStack_c0 = (pointer)0x0;
    local_b8 = (pointer)0x3ff0000000000000;
    uVar8 = 0;
    ::std::__cxx11::string::_M_replace((ulong)&local_358,0,(char *)0x0,0x6208e3);
    local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"/","");
    local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"","");
    Path::Path((Path *)local_640,&local_378,&local_398);
    Path::operator=((Path *)local_338,(Path *)local_640);
    if ((undefined1 *)local_640._160_8_ != local_640 + 0xb0) {
      operator_delete((void *)local_640._160_8_,CONCAT71(local_640._177_7_,local_640[0xb0]) + 1);
    }
    if ((undefined1 *)local_640._128_8_ != local_640 + 0x90) {
      operator_delete((void *)local_640._128_8_,CONCAT71(local_640._145_7_,local_640[0x90]) + 1);
    }
    if ((undefined1 *)local_640._96_8_ != local_640 + 0x70) {
      operator_delete((void *)local_640._96_8_,CONCAT71(local_640._113_7_,local_640[0x70]) + 1);
    }
    if ((undefined1 *)local_640._64_8_ != local_640 + 0x50) {
      operator_delete((void *)local_640._64_8_,CONCAT71(local_640._81_7_,local_640[0x50]) + 1);
    }
    if ((undefined1 *)local_640._32_8_ != local_640 + 0x30) {
      operator_delete((void *)local_640._32_8_,CONCAT71(local_640._49_7_,local_640[0x30]) + 1);
    }
    if ((undefined1 *)local_640._0_8_ != local_640 + 0x10) {
      operator_delete((void *)local_640._0_8_,CONCAT71(local_640._17_7_,local_640[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    oStack_240.contained._0_2_ = 0;
    local_270._24_8_ = (XformNode *)0x0;
    local_270._8_8_ = (Prim *)0x0;
    local_270._16_8_ = -1;
    local_130.has_value_ = false;
    local_130._1_7_ = 0x3ff00000000000;
    local_130.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_130.contained._8_8_ = 0;
    local_130.contained._16_8_ = 0;
    local_130.contained._24_8_ = 0;
    local_108._0_8_ = 0x3ff0000000000000;
    local_108.super__Rb_tree_header._M_header._M_color = _S_red;
    local_108.super__Rb_tree_header._M_header._4_4_ = 0;
    local_108.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_108.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_108.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_108.super__Rb_tree_header._M_node_count = 0x3ff0000000000000;
    local_d8 = (pointer)0x0;
    pSStack_d0 = (pointer)0x0;
    local_c8 = (pointer)0x0;
    pPStack_c0 = (pointer)0x0;
    local_b8 = (pointer)0x3ff0000000000000;
    local_1b8.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x3ff0000000000000;
    local_1b8.contained._8_8_ = 0;
    local_1b8.contained._16_8_ = 0;
    local_1b8.contained._24_8_ = 0;
    local_1b8.contained._32_8_ = 0;
    local_1b8.contained._40_8_ = 0x3ff0000000000000;
    local_180.has_value_ = false;
    local_180._1_7_ = 0;
    local_180.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_180.contained._8_8_ = 0;
    local_180.contained._16_8_ = 0;
    local_180.contained._24_8_ = 0x3ff0000000000000;
    local_158.has_value_ = false;
    local_158._1_7_ = 0;
    local_158.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_158.contained._8_8_ = 0;
    local_158.contained._16_8_ = 0;
    local_158.contained._24_8_ = 0x3ff0000000000000;
    local_230.has_value_ = false;
    local_230._1_7_ = 0x3ff00000000000;
    local_230.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_230.contained._8_8_ = 0;
    local_230.contained._16_8_ = 0;
    local_230.contained._24_8_ = 0;
    local_208.has_value_ = false;
    local_208._1_7_ = 0x3ff00000000000;
    local_208.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_208.contained._8_8_ = 0;
    local_208.contained._16_8_ = 0;
    local_208.contained._24_8_ = 0;
    local_1e0.has_value_ = false;
    local_1e0._1_7_ = 0x3ff00000000000;
    local_1e0.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_1e0.contained._8_8_ = 0;
    local_1e0.contained._16_8_ = 0;
    local_1e0.contained._24_8_ = 0;
    local_1b8.has_value_ = false;
    local_1b8._1_7_ = 0x3ff00000000000;
    parent_abs_path =
         (stage->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
         _M_impl.super__Vector_impl_data._M_start;
    pPVar2 = (stage->_root_nodes).
             super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar9 = parent_abs_path == pPVar2;
    if (!bVar9) {
      pcVar1 = local_640 + 0xb0;
      do {
        oVar5 = (optional<tinyusdz::Path::PathType>)((long)local_640 + 0xd0);
        local_640._0_8_ = local_640 + 0x10;
        local_640._8_8_ = 0;
        local_640[0x10] = '\0';
        local_640._32_8_ = local_640 + 0x30;
        local_640._40_8_ = 0;
        local_640[0x30] = '\0';
        local_640._64_8_ = local_640 + 0x50;
        local_640._72_8_ = 0;
        local_640[0x50] = '\0';
        local_640._96_8_ = local_640 + 0x70;
        local_640._104_8_ = 0;
        local_640[0x70] = '\0';
        local_640._128_8_ = local_640 + 0x90;
        local_640._136_8_ = 0;
        local_640[0x90] = '\0';
        local_640._168_8_ = 0;
        local_640[0xb0] = '\0';
        local_640._200_8_ = 0;
        local_640[0xd0] = 0;
        local_640[0xe0] = '\0';
        local_640._228_4_ = 0;
        local_640[0xe8] = '\0';
        local_640._240_8_ = (pointer)0x0;
        local_640._248_8_ = 0xffffffffffffffff;
        local_530._M_p = (pointer)0x0;
        sStack_528 = 0;
        local_640._256_8_ = 0;
        local_640._264_8_ = 0;
        local_520._M_allocated_capacity._0_2_ = 0;
        local_520._8_8_ = 0x3ff0000000000000;
        local_500._M_allocated_capacity = 0;
        local_500._8_8_ = 0;
        local_510._M_p = (pointer)0x0;
        sStack_508 = 0;
        local_4f0._M_p = (pointer)0x3ff0000000000000;
        aStack_4e0._8_8_ = 0;
        _Stack_4d0._M_p = (pointer)0x0;
        local_4e8 = 0;
        aStack_4e0._M_allocated_capacity = 0;
        local_4c8 = 0x3ff0000000000000;
        local_4b0.has_value_ = false;
        local_4b0._1_3_ = 0;
        local_4b0.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
        uStack_4a8._0_1_ = false;
        uStack_4a8._1_7_ = 0;
        local_4c0._M_allocated_capacity = 0;
        local_4c0._8_8_ = 0;
        local_4a0._M_p = (pointer)0x3ff0000000000000;
        local_498 = 0x3ff0000000000000;
        local_480._M_p = (pointer)0x0;
        sStack_478 = 0;
        local_490._M_allocated_capacity = 0;
        local_490._8_8_ = 0;
        local_470._M_allocated_capacity = 0x3ff0000000000000;
        local_458 = 0;
        aStack_450._M_allocated_capacity = 0;
        local_470._8_8_ = 0;
        _Stack_460._M_p = (pointer)0x0;
        aStack_450._8_8_ = 0x3ff0000000000000;
        local_430._M_allocated_capacity = 0;
        local_430._8_8_ = 0;
        local_440._M_p = (pointer)0x0;
        sStack_438 = 0;
        local_420._M_p = (pointer)0x3ff0000000000000;
        local_418 = 0x3ff0000000000000;
        local_400._M_p = (pointer)0x0;
        sStack_3f8 = 0;
        local_410._M_allocated_capacity = 0;
        local_410._8_8_ = 0;
        local_3f0._M_allocated_capacity = 0x3ff0000000000000;
        local_3d8._0_1_ = false;
        local_3d8._1_7_ = 0;
        _Stack_3d0._M_p = (pointer)0x0;
        local_3f0._8_8_ = 0;
        oStack_3e0.has_value_ = false;
        oStack_3e0._1_3_ = 0;
        oStack_3e0.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
        local_3c8 = 0x3ff0000000000000;
        local_3b0._0_4_ = Def;
        local_3b0._4_4_ = 0;
        sStack_3a8.dynamic = (void *)0x0;
        local_3c0._M_allocated_capacity = 0;
        local_3c0._8_8_ = 0;
        sStack_3a8._8_8_ = 0x3ff0000000000000;
        local_b0 = (pointer)0x3ff0000000000000;
        local_98._0_1_ = false;
        local_98._1_7_ = 0;
        _Stack_90._M_p = (pointer)0x0;
        local_a8.has_value_ = false;
        local_a8._1_3_ = 0;
        local_a8.contained = (storage_t<tinyusdz::Axis>)0x0;
        uStack_a0._0_1_ = false;
        uStack_a0._1_3_ = 0;
        uStack_a0._4_4_ = X;
        local_88 = 0x3ff0000000000000;
        local_70.has_value_ = false;
        local_70._1_3_ = 0;
        local_70.contained = (storage_t<tinyusdz::Interpolation>)0x0;
        oStack_68.has_value_ = false;
        oStack_68._1_3_ = 0;
        oStack_68.contained = (storage_t<unsigned_int>)0x0;
        local_80._M_allocated_capacity = 0;
        local_80._8_8_ = 0;
        local_60._0_1_ = false;
        local_60._1_1_ = (storage_t<bool>)0x0;
        local_60._2_6_ = 0x3ff000000000;
        local_48 = 0;
        uStack_40 = 0;
        local_58._0_1_ = false;
        local_58._1_7_ = 0;
        uStack_50 = (anon_struct_8_0_00000001_for___align)0x0;
        local_38 = 0x3ff0000000000000;
        ppPVar6 = &local_b0;
        puVar7 = (undefined8 *)&stack0xfffffffffffff908;
        local_640._160_8_ = pcVar1;
        local_640._192_8_ = oVar5;
        for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
          *puVar7 = *ppPVar6;
          ppPVar6 = ppPVar6 + (ulong)bVar10 * -2 + 1;
          puVar7 = puVar7 + (ulong)bVar10 * -2 + 1;
        }
        bVar3 = anon_unknown_6::BuildXformNodeFromStageRec
                          ((Stage *)local_338,&parent_abs_path->_abs_path,(Prim *)local_640,
                           (XformNode *)(ulong)tinterp,in_stack_fffffffffffff908,t,
                           (TimeSampleInterpolationType)uVar8);
        if (!bVar3) {
          ::std::vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>::
          ~vector((vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_> *
                  )(local_640 + 0x108));
          if ((optional<tinyusdz::Path::PathType>)local_640._192_8_ != oVar5) {
            operator_delete((void *)local_640._192_8_,
                            CONCAT71(local_640._209_7_,local_640[0xd0]) + 1);
          }
          if ((pointer)local_640._160_8_ != pcVar1) {
            operator_delete((void *)local_640._160_8_,
                            CONCAT71(local_640._177_7_,local_640[0xb0]) + 1);
          }
          if ((undefined1 *)local_640._128_8_ != local_640 + 0x90) {
            operator_delete((void *)local_640._128_8_,
                            CONCAT71(local_640._145_7_,local_640[0x90]) + 1);
          }
          if ((undefined1 *)local_640._96_8_ != local_640 + 0x70) {
            operator_delete((void *)local_640._96_8_,CONCAT71(local_640._113_7_,local_640[0x70]) + 1
                           );
          }
          if ((undefined1 *)local_640._64_8_ != local_640 + 0x50) {
            operator_delete((void *)local_640._64_8_,CONCAT71(local_640._81_7_,local_640[0x50]) + 1)
            ;
          }
          if ((undefined1 *)local_640._32_8_ != local_640 + 0x30) {
            operator_delete((void *)local_640._32_8_,CONCAT71(local_640._49_7_,local_640[0x30]) + 1)
            ;
          }
          if ((undefined1 *)local_640._0_8_ != local_640 + 0x10) {
            operator_delete((void *)local_640._0_8_,CONCAT71(local_640._17_7_,local_640[0x10]) + 1);
          }
          goto LAB_004f6b13;
        }
        ::std::vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>::
        emplace_back<tinyusdz::tydra::XformNode>
                  ((vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>
                    *)(local_270 + 0x20),(XformNode *)local_640);
        ::std::vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>::
        ~vector((vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_> *)
                (local_640 + 0x108));
        if ((optional<tinyusdz::Path::PathType>)local_640._192_8_ != oVar5) {
          operator_delete((void *)local_640._192_8_,CONCAT71(local_640._209_7_,local_640[0xd0]) + 1)
          ;
        }
        if ((pointer)local_640._160_8_ != pcVar1) {
          operator_delete((void *)local_640._160_8_,CONCAT71(local_640._177_7_,local_640[0xb0]) + 1)
          ;
        }
        if ((undefined1 *)local_640._128_8_ != local_640 + 0x90) {
          operator_delete((void *)local_640._128_8_,CONCAT71(local_640._145_7_,local_640[0x90]) + 1)
          ;
        }
        if ((undefined1 *)local_640._96_8_ != local_640 + 0x70) {
          operator_delete((void *)local_640._96_8_,CONCAT71(local_640._113_7_,local_640[0x70]) + 1);
        }
        if ((undefined1 *)local_640._64_8_ != local_640 + 0x50) {
          operator_delete((void *)local_640._64_8_,CONCAT71(local_640._81_7_,local_640[0x50]) + 1);
        }
        if ((undefined1 *)local_640._32_8_ != local_640 + 0x30) {
          operator_delete((void *)local_640._32_8_,CONCAT71(local_640._49_7_,local_640[0x30]) + 1);
        }
        if ((undefined1 *)local_640._0_8_ != local_640 + 0x10) {
          operator_delete((void *)local_640._0_8_,CONCAT71(local_640._17_7_,local_640[0x10]) + 1);
        }
        parent_abs_path = parent_abs_path + 1;
        bVar9 = parent_abs_path == pPVar2;
      } while (!bVar9);
    }
    ::std::__cxx11::string::_M_assign((string *)rootNode);
    Path::operator=(&rootNode->absolute_path,(Path *)local_338);
    rootNode->prim = (Prim *)local_270._8_8_;
    rootNode->prim_id = local_270._16_8_;
    rootNode->parent = (XformNode *)local_270._24_8_;
    ::std::vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>::
    operator=(&rootNode->children,
              (vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_> *)
              (local_270 + 0x20));
    memcpy(&rootNode->_has_xform,&oStack_240.contained,0x188);
LAB_004f6b13:
    ::std::vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>::~vector
              ((vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_> *)
               (local_270 + 0x20));
    if ((undefined1 *)local_2a8._16_8_ != local_2a8 + 0x20) {
      operator_delete((void *)local_2a8._16_8_,CONCAT71(local_2a8._33_7_,local_2a8[0x20]) + 1);
    }
    if (local_2b8._M_p != local_2a8) {
      operator_delete(local_2b8._M_p,CONCAT71(local_2a8._1_7_,local_2a8[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8 != &local_2c8) {
      operator_delete((void *)local_2d8,
                      CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_p != &local_2e8) {
      operator_delete(local_2f8._M_p,
                      CONCAT71(local_2e8._M_allocated_capacity._1_7_,local_2e8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_p != &local_308) {
      operator_delete(local_318._M_p,
                      CONCAT71(local_308._M_allocated_capacity._1_7_,local_308._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
      operator_delete((void *)local_338._0_8_,CONCAT71(local_338._17_7_,local_338[0x10]) + 1);
    }
    if (local_358 != (_Base_ptr)local_348) {
      operator_delete(local_358,CONCAT71(local_348._1_7_,local_348[0]) + 1);
    }
  }
  return bVar9;
}

Assistant:

bool BuildXformNodeFromStage(
    const tinyusdz::Stage &stage, XformNode *rootNode, /* out */
    const double t,
    const tinyusdz::value::TimeSampleInterpolationType tinterp) {
  if (!rootNode) {
    return false;
  }

  XformNode stage_root;
  stage_root.element_name = "";  // Stage root element name is empty.
  stage_root.absolute_path = Path("/", "");
  stage_root.has_xform() = false;
  stage_root.parent = nullptr;
  stage_root.prim = nullptr;  // No prim for stage root.
  stage_root.prim_id = -1;
  stage_root.has_resetXformStack() = false;
  stage_root.set_parent_world_matrix(value::matrix4d::identity());
  stage_root.set_world_matrix(value::matrix4d::identity());
  stage_root.set_local_matrix(value::matrix4d::identity());

  for (const auto &root : stage.root_prims()) {
    XformNode node;

    value::matrix4d rootMat{value::matrix4d::identity()};

    if (!BuildXformNodeFromStageRec(stage, stage_root.absolute_path, &root,
                                    &node, rootMat, t, tinterp)) {
      return false;
    }

    stage_root.children.emplace_back(std::move(node));
  }

  (*rootNode) = stage_root;

  return true;
}